

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::CanDeadStoreInstrForScopeObjRemoval(BackwardPass *this,Sym *sym)

{
  OpCode OVar1;
  Func *this_00;
  bool bVar2;
  BackwardPass *this_01;
  HelperCallOpnd *pHVar3;
  StackSym *pSVar4;
  Instr *pIVar5;
  RegOpnd *this_02;
  
  if (this->tag != DeadStorePhase) {
    return false;
  }
  bVar2 = Func::IsStackArgsEnabled(this->currentInstr->m_func);
  if (bVar2) {
    this_00 = this->currentInstr->m_func;
    this_01 = (BackwardPass *)Func::GetJITFunctionBody(this_00);
    bVar2 = JITTimeFunctionBody::GetDoScopeObjectCreation((JITTimeFunctionBody *)this_01);
    pIVar5 = this->currentInstr;
    OVar1 = pIVar5->m_opcode;
    if (OVar1 - 0xdb < 2) {
      if (!bVar2) {
        this_02 = (RegOpnd *)pIVar5->m_src1;
LAB_003cad30:
        bVar2 = IR::Opnd::IsScopeObjOpnd(&this_02->super_Opnd,this_00);
        return bVar2;
      }
    }
    else if (OVar1 - 0x282 < 2) {
      if (!bVar2) {
        this_02 = (RegOpnd *)pIVar5->m_src2;
        goto LAB_003cad30;
      }
    }
    else {
      if (OVar1 == LdSlot) {
        if (sym == (Sym *)0x0) {
          return false;
        }
        bVar2 = IsFormalParamSym(this_01,this_00,sym);
      }
      else {
        if (OVar1 == CallHelper) {
          if (bVar2) {
            return false;
          }
          pHVar3 = IR::Opnd::AsHelperCallOpnd(pIVar5->m_src1);
          if (pHVar3->m_fnHelper != HelperOP_InitCachedFuncs) {
            return false;
          }
          pSVar4 = IR::Opnd::GetStackSym(this->currentInstr->m_src2);
          if ((pSVar4->field_0x18 & 1) == 0) {
            pIVar5 = (Instr *)0x0;
          }
          else {
            pIVar5 = (pSVar4->field_5).m_instrDef;
          }
          this_02 = IR::Opnd::AsRegOpnd(pIVar5->m_src1);
          goto LAB_003cad30;
        }
        if (OVar1 != InitCachedScope) {
          return false;
        }
        if (bVar2) {
          return false;
        }
        bVar2 = IR::Opnd::IsScopeObjOpnd(pIVar5->m_dst,this_00);
      }
      if (bVar2 != false) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::CanDeadStoreInstrForScopeObjRemoval(Sym *sym) const
{
    if (tag == Js::DeadStorePhase && this->currentInstr->m_func->IsStackArgsEnabled())
    {
        Func * currFunc = this->currentInstr->m_func;
        bool doScopeObjCreation = currFunc->GetJITFunctionBody()->GetDoScopeObjectCreation();
        switch (this->currentInstr->m_opcode)
        {
            case Js::OpCode::InitCachedScope:
            {
                if(!doScopeObjCreation && this->currentInstr->GetDst()->IsScopeObjOpnd(currFunc))
                {
                    /*
                    *   We don't really dead store this instruction. We just want the source sym of this instruction
                    *   to NOT be tracked as USED by this instruction.
                    *   This instr will effectively be lowered to dest = MOV NULLObject, in the lowerer phase.
                    */
                    return true;
                }
                break;
            }
            case Js::OpCode::LdSlot:
            {
                if (sym && IsFormalParamSym(currFunc, sym))
                {
                    return true;
                }
                break;
            }
            case Js::OpCode::CommitScope:
            case Js::OpCode::GetCachedFunc:
            {
                return !doScopeObjCreation && this->currentInstr->GetSrc1()->IsScopeObjOpnd(currFunc);
            }
            case Js::OpCode::BrFncCachedScopeEq:
            case Js::OpCode::BrFncCachedScopeNeq:
            {
                return !doScopeObjCreation && this->currentInstr->GetSrc2()->IsScopeObjOpnd(currFunc);
            }
            case Js::OpCode::CallHelper:
            {
                if (!doScopeObjCreation && this->currentInstr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperOP_InitCachedFuncs)
                {
                    IR::RegOpnd * scopeObjOpnd = this->currentInstr->GetSrc2()->GetStackSym()->GetInstrDef()->GetSrc1()->AsRegOpnd();
                    return scopeObjOpnd->IsScopeObjOpnd(currFunc);
                }
                break;
            }
        }
    }
    return false;
}